

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  char cVar1;
  pointer paVar2;
  type_info *tp;
  function_record *pfVar3;
  handle obj;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  type_info *ptVar7;
  function_record *pfVar8;
  function_record *pfVar9;
  undefined1 *puVar10;
  PyMethodDef *pPVar11;
  PyObject *pPVar12;
  PyObject *pPVar13;
  object *object;
  long lVar14;
  pointer paVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  string signatures;
  allocator local_1aa;
  allocator local_1a9;
  ulong local_1a8;
  size_t local_1a0;
  type_info **local_198;
  capsule rec_capsule_1;
  object scope_module;
  object local_140;
  str local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string signature;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  PyObject *local_48;
  char *local_40;
  undefined8 local_38;
  
  pcVar6 = "";
  if (rec->name != (char *)0x0) {
    pcVar6 = rec->name;
  }
  local_1a0 = args;
  local_198 = types;
  pcVar6 = strdup(pcVar6);
  rec->name = pcVar6;
  if (rec->doc != (char *)0x0) {
    pcVar6 = strdup(rec->doc);
    rec->doc = pcVar6;
  }
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar15 = (rec->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start; paVar15 != paVar2;
      paVar15 = paVar15 + 0x20) {
    if (*(char **)paVar15 != (char *)0x0) {
      pcVar6 = strdup(*(char **)paVar15);
      *(char **)paVar15 = pcVar6;
    }
    if (*(char **)(paVar15 + 8) == (char *)0x0) {
      if (*(size_type *)(paVar15 + 0x10) != 0) {
        signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_27501;
        signatures.field_2._8_8_ = 0;
        signatures._M_string_length = *(size_type *)(paVar15 + 0x10);
        detail::
        object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
        operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                    *)&rec_capsule_1);
        cast<std::__cxx11::string>(&signature,(pybind11 *)&rec_capsule_1,object);
        pcVar6 = strdup(signature._M_dataplus._M_p);
        *(char **)(paVar15 + 8) = pcVar6;
        std::__cxx11::string::~string((string *)&signature);
        pybind11::object::~object((object *)&rec_capsule_1);
        pybind11::object::~object((object *)((long)&signatures.field_2 + 8));
      }
    }
    else {
      pcVar6 = strdup(*(char **)(paVar15 + 8));
      *(char **)(paVar15 + 8) = pcVar6;
    }
  }
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  signature._M_string_length = 0;
  signature.field_2._M_local_buf[0] = '\0';
  local_1a8 = 0;
  lVar14 = 0;
  lVar17 = 0;
  do {
    lVar16 = 0;
    lVar18 = lVar17;
LAB_0011b5dc:
    uVar4 = local_1a8;
    lVar17 = lVar18 + 1;
    cVar1 = text[lVar18];
    if (cVar1 == '\0') {
      if ((lVar16 != 0) || (local_198[lVar14] != (type_info *)0x0)) {
        pybind11_fail("Internal error while parsing type signature (2)");
      }
      pcVar6 = strdup(signature._M_dataplus._M_p);
      rec->signature = pcVar6;
      std::
      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ::_M_shrink_to_fit(&rec->args);
      pcVar6 = rec->name;
      iVar5 = strcmp(pcVar6,"__init__");
      if (iVar5 == 0) {
        bVar19 = true;
      }
      else {
        iVar5 = strcmp(pcVar6,"__setstate__");
        bVar19 = iVar5 == 0;
      }
      rec->field_0x59 = rec->field_0x59 & 0xfe | bVar19;
      rec->nargs = (uint16_t)local_1a0;
      pPVar12 = (rec->sibling).m_ptr;
      if (pPVar12 != (PyObject *)0x0) {
        if (pPVar12->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
          pPVar12 = (PyObject *)pPVar12[1].ob_refcnt;
          (rec->sibling).m_ptr = pPVar12;
          if (pPVar12 == (PyObject *)0x0) goto LAB_0011b9a7;
        }
        if (pPVar12->ob_type != (PyTypeObject *)&PyCFunction_Type) {
          iVar5 = PyType_IsSubtype(pPVar12->ob_type,&PyCFunction_Type);
          pPVar12 = (rec->sibling).m_ptr;
          if (iVar5 == 0) {
            if ((pPVar12 != (PyObject *)&_Py_NoneStruct) && (*rec->name != '_')) {
              std::__cxx11::string::string
                        ((string *)&scope_module,rec->name,(allocator *)&local_130);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &rec_capsule_1,"Cannot overload existing non-function object \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &scope_module);
              std::operator+(&signatures,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &rec_capsule_1,"\" with a function of the same name");
              pybind11_fail(&signatures);
            }
            goto LAB_0011b9a7;
          }
        }
        if ((*(byte *)(pPVar12[1].ob_refcnt + 0x10) & 0x20) == 0) {
          signatures._M_dataplus._M_p = (pointer)pPVar12[1].ob_type;
          if ((PyTypeObject *)signatures._M_dataplus._M_p != (PyTypeObject *)0x0) {
            (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
                 (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
          }
        }
        else {
          signatures._M_dataplus._M_p = (pointer)0x0;
        }
        pfVar8 = capsule::operator_cast_to_function_record_((capsule *)&signatures);
        pPVar12 = (pfVar8->scope).m_ptr;
        pPVar13 = (rec->scope).m_ptr;
        pybind11::object::~object((object *)&signatures);
        if (pPVar12 == pPVar13) {
          pPVar12 = (rec->sibling).m_ptr;
          (this->super_function).super_object.super_handle.m_ptr = pPVar12;
          if (pPVar12 != (PyObject *)0x0) {
            pPVar12->ob_refcnt = pPVar12->ob_refcnt + 1;
          }
          pfVar3 = pfVar8;
          if (((pfVar8->field_0x59 ^ rec->field_0x59) & 0x20) != 0) {
            pcVar6 = "instance";
            if ((rec->field_0x59 & 0x20) == 0) {
              pcVar6 = "static";
            }
            std::__cxx11::string::string((string *)&local_b0,pcVar6,&local_1a9);
            std::operator+(&local_90,
                           "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                           ,&local_b0);
            std::operator+(&local_70,&local_90," method ");
            local_48 = (rec->scope).m_ptr;
            local_40 = "__name__";
            local_38 = 0;
            detail::accessor::operator_cast_to_object((accessor *)&local_140);
            str::str(&local_138,&local_140);
            str::operator_cast_to_string(&local_d0,&local_138);
            std::operator+(&local_130,&local_70,&local_d0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scope_module,&local_130,".");
            std::__cxx11::string::string((string *)&local_f0,rec->name,&local_1aa);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rec_capsule_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scope_module,&local_f0);
            std::operator+(&signatures,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rec_capsule_1,&signature);
            pybind11_fail(&signatures);
          }
          do {
            pfVar9 = pfVar3;
            pfVar3 = pfVar9->next;
          } while (pfVar3 != (function_record *)0x0);
          pfVar9->next = rec;
          signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
          signatures._M_string_length = 0;
          signatures.field_2._M_allocated_capacity =
               signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
          puVar10 = &options::global_state()::instance;
          if (DAT_0012bf29 == 1) {
            std::__cxx11::string::append((char *)&signatures);
            std::__cxx11::string::append((char *)&signatures);
            puVar10 = (undefined1 *)std::__cxx11::string::append((char *)&signatures);
          }
          local_198 = (type_info **)((ulong)local_198 & 0xffffffff00000000);
LAB_0011baf3:
          local_1a0 = CONCAT44(local_1a0._4_4_,(int)CONCAT71((int7)((ulong)puVar10 >> 8),1));
          iVar5 = 0;
          for (; pfVar8 != (function_record *)0x0; pfVar8 = pfVar8->next) {
            if (DAT_0012bf29 == 1) {
              if (0 < iVar5) {
                std::__cxx11::string::append((char *)&signatures);
              }
              if ((char)local_198 == '\0') {
                iVar5 = iVar5 + 1;
                std::__cxx11::to_string((string *)&scope_module,iVar5);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &rec_capsule_1,(string *)&scope_module,". ");
                std::__cxx11::string::append((string *)&signatures);
                std::__cxx11::string::~string((string *)&rec_capsule_1);
                std::__cxx11::string::~string((string *)&scope_module);
              }
              std::__cxx11::string::append((char *)&signatures);
              std::__cxx11::string::append((char *)&signatures);
              std::__cxx11::string::append((char *)&signatures);
            }
            if (((pfVar8->doc != (char *)0x0) && (*pfVar8->doc != '\0')) &&
               (options::global_state()::instance == '\x01')) {
              if (((DAT_0012bf29 | (byte)local_1a0) & 1) == 0) {
                std::__cxx11::string::append((char *)&signatures);
                local_1a0 = local_1a0 & 0xffffffff00000000;
              }
              else {
                local_1a0 = CONCAT44(local_1a0._4_4_,
                                     CONCAT31((int3)(local_1a0 >> 8),(byte)local_1a0 & DAT_0012bf29)
                                    );
              }
              if ((DAT_0012bf29 & 1) != 0) {
                std::__cxx11::string::append((char *)&signatures);
              }
              std::__cxx11::string::append((char *)&signatures);
              if (DAT_0012bf29 == 1) {
                std::__cxx11::string::append((char *)&signatures);
              }
            }
          }
          pPVar12 = (this->super_function).super_object.super_handle.m_ptr;
          free(*(void **)(pPVar12[1].ob_refcnt + 0x18));
          pcVar6 = strdup(signatures._M_dataplus._M_p);
          *(char **)(pPVar12[1].ob_refcnt + 0x18) = pcVar6;
          if ((rec->field_0x59 & 0x20) != 0) {
            pPVar13 = (PyObject *)
                      PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
            (this->super_function).super_object.super_handle.m_ptr = pPVar13;
            if (pPVar13 == (PyObject *)0x0) {
              pybind11_fail(
                           "cpp_function::cpp_function(): Could not allocate instance method object"
                           );
            }
            _Py_DECREF(pPVar12);
          }
          std::__cxx11::string::~string((string *)&signatures);
          std::__cxx11::string::~string((string *)&signature);
          return;
        }
      }
LAB_0011b9a7:
      pPVar11 = (PyMethodDef *)operator_new(0x20);
      rec->def = pPVar11;
      *(undefined8 *)&pPVar11->ml_flags = 0;
      pPVar11->ml_doc = (char *)0x0;
      pPVar11->ml_name = rec->name;
      pPVar11->ml_meth = dispatcher;
      pPVar11->ml_flags = 3;
      capsule::capsule(&rec_capsule_1,rec,initialize_generic::anon_class_1_0_00000001::__invoke);
      scope_module.super_handle.m_ptr = (handle)(PyObject *)0x0;
      obj.m_ptr = (rec->scope).m_ptr;
      if (obj.m_ptr != (PyObject *)0x0) {
        bVar19 = hasattr(obj,"__module__");
        if (bVar19) {
          signatures._M_string_length = (size_type)(rec->scope).m_ptr;
          signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_2739b;
          signatures.field_2._8_8_ = 0;
          detail::accessor::operator_cast_to_object((accessor *)&local_130);
        }
        else {
          bVar19 = hasattr((rec->scope).m_ptr,"__name__");
          if (!bVar19) goto LAB_0011ba9e;
          signatures._M_string_length = (size_type)(rec->scope).m_ptr;
          signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_27123;
          signatures.field_2._8_8_ = 0;
          detail::accessor::operator_cast_to_object((accessor *)&local_130);
        }
        pybind11::object::operator=(&scope_module,(object *)&local_130);
        pybind11::object::~object((object *)&local_130);
        pybind11::object::~object((object *)((long)&signatures.field_2 + 8));
      }
LAB_0011ba9e:
      pPVar12 = (PyObject *)
                PyCMethod_New(rec->def,rec_capsule_1.super_object.super_handle.m_ptr,
                              scope_module.super_handle.m_ptr,0);
      (this->super_function).super_object.super_handle.m_ptr = pPVar12;
      if (pPVar12 == (PyObject *)0x0) {
        pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
      }
      pybind11::object::~object(&scope_module);
      pybind11::object::~object(&rec_capsule_1.super_object);
      signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
      signatures._M_string_length = 0;
      signatures.field_2._M_allocated_capacity =
           signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
      puVar10 = (undefined1 *)CONCAT71((int7)((ulong)signatures._M_dataplus._M_p >> 8),1);
      local_198 = (type_info **)CONCAT44(local_198._4_4_,(int)puVar10);
      pfVar8 = rec;
      goto LAB_0011baf3;
    }
    lVar18 = lVar17;
    if (cVar1 == '%') {
      tp = local_198[lVar14];
      if (tp == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      ptVar7 = detail::get_type_info(tp,false);
      lVar14 = lVar14 + 1;
      if (ptVar7 == (type_info *)0x0) {
        std::__cxx11::string::string
                  ((string *)&signatures,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                   (allocator *)&rec_capsule_1);
        detail::clean_type_id(&signatures);
        std::__cxx11::string::append((string *)&signature);
        std::__cxx11::string::~string((string *)&signatures);
      }
      else {
        std::__cxx11::string::append((char *)&signature);
      }
      goto LAB_0011b5dc;
    }
    if (cVar1 != '}') {
      if (cVar1 == '{') {
        if ((lVar16 == 0) && (text[lVar17] != '*' && local_1a8 < local_1a0)) {
          paVar15 = (rec->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((paVar15 ==
                (rec->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_finish) ||
              (*(long *)(paVar15 + local_1a8 * 0x20) == 0)) &&
             ((rec->field_0x59 & 0x20) == 0 || local_1a8 != 0)) {
            std::__cxx11::to_string
                      ((string *)&rec_capsule_1,local_1a8 - (((byte)rec->field_0x59 >> 5 & 1) != 0))
            ;
            std::operator+(&signatures,"arg",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rec_capsule_1);
            std::__cxx11::string::append((string *)&signature);
            std::__cxx11::string::~string((string *)&signatures);
            std::__cxx11::string::~string((string *)&rec_capsule_1);
          }
          else {
            std::__cxx11::string::append((char *)&signature);
          }
          std::__cxx11::string::append((char *)&signature);
        }
        lVar16 = lVar16 + 1;
      }
      else {
        std::__cxx11::string::push_back((char)&signature);
      }
      goto LAB_0011b5dc;
    }
    lVar16 = lVar16 + -1;
    if (lVar16 != 0) goto LAB_0011b5dc;
    paVar15 = (rec->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((local_1a8 <
         (ulong)((long)(rec->args).
                       super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)paVar15 >> 5)) &&
       (*(long *)(paVar15 + local_1a8 * 0x20 + 8) != 0)) {
      std::__cxx11::string::append((char *)&signature);
      std::__cxx11::string::append((char *)&signature);
    }
    local_1a8 = uVar4 + 1;
  } while( true );
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        /* Generate a proper function signature */
        std::string signature;
        size_t type_depth = 0, char_index = 0, type_index = 0, arg_index = 0;
        while (true) {
            char c = text[char_index++];
            if (c == '\0')
                break;

            if (c == '{') {
                // Write arg name for everything except *args, **kwargs and return type.
                if (type_depth == 0 && text[char_index] != '*' && arg_index < args) {
                    if (!rec->args.empty() && rec->args[arg_index].name) {
                        signature += rec->args[arg_index].name;
                    } else if (arg_index == 0 && rec->is_method) {
                        signature += "self";
                    } else {
                        signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                    }
                    signature += ": ";
                }
                ++type_depth;
            } else if (c == '}') {
                --type_depth;
                if (type_depth == 0) {
                    if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                        signature += "=";
                        signature += rec->args[arg_index].descr;
                    }
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
#if defined(PYPY_VERSION)
                    signature += handle((PyObject *) tinfo->type)
                                     .attr("__module__")
                                     .cast<std::string>() + ".";
#endif
                    signature += tinfo->type->tp_name;
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (type_depth != 0 || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

        #if !defined(PYBIND11_CONSTEXPR_DESCR)
            delete[] types;
            delete[] text;
        #endif

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(*dispatcher);
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }